

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

void envy_bios_print_power_boost(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_power_boost *peVar1;
  envy_bios_power_boost_subentry *peVar2;
  envy_bios_power_boost_subentry *sub;
  int j;
  int i;
  envy_bios_power_boost *boost;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &(bios->power).boost;
  if ((peVar1->offset != 0) && ((mask & 0x400) != 0)) {
    if ((bios->power).boost.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse BOOST table at 0x%x, version %x\n",(ulong)peVar1->offset,
              (ulong)(bios->power).boost.version);
    }
    else {
      fprintf((FILE *)out,"BOOST table at 0x%x, version %x\n",(ulong)peVar1->offset,
              (ulong)(bios->power).boost.version);
      envy_bios_dump_hex(bios,out,peVar1->offset,(uint)(bios->power).boost.hlen,mask);
      if ((mask & 0x80000000) != 0) {
        fprintf((FILE *)out,"\n");
      }
      for (sub._4_4_ = 0; (int)sub._4_4_ < (int)(uint)(bios->power).boost.entriesnum;
          sub._4_4_ = sub._4_4_ + 1) {
        fprintf((FILE *)out,"\t%i: pstate %x min %d MHz max %d MHz\n",(ulong)sub._4_4_,
                (ulong)(bios->power).boost.entries[(int)sub._4_4_].pstate,
                (ulong)(bios->power).boost.entries[(int)sub._4_4_].min,
                (ulong)(bios->power).boost.entries[(int)sub._4_4_].max);
        envy_bios_dump_hex(bios,out,(bios->power).boost.entries[(int)sub._4_4_].offset,
                           (uint)(bios->power).boost.rlen,mask);
        if ((mask & 0x80000000) != 0) {
          fprintf((FILE *)out,"\n");
        }
        for (sub._0_4_ = 0; (int)(uint)sub < (int)(uint)(bios->power).boost.snr;
            sub._0_4_ = (uint)sub + 1) {
          peVar2 = (bios->power).boost.entries[(int)sub._4_4_].entries + (int)(uint)sub;
          fprintf(_stdout,"\t\t%i: domain %x percent %d min %d max %d\n",(ulong)(uint)sub,
                  (ulong)peVar2->domain,(ulong)peVar2->percent,(ulong)peVar2->min,(uint)peVar2->max)
          ;
          envy_bios_dump_hex(bios,out,peVar2->offset,(uint)(bios->power).boost.ssz,mask);
          if ((mask & 0x80000000) != 0) {
            fprintf((FILE *)out,"\n");
          }
        }
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_power_boost(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_boost *boost = &bios->power.boost;
	int i, j;

	if (!boost->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!boost->valid) {
		fprintf(out, "Failed to parse BOOST table at 0x%x, version %x\n", boost->offset, boost->version);
		return;
	}

	fprintf(out, "BOOST table at 0x%x, version %x\n", boost->offset, boost->version);
	envy_bios_dump_hex(bios, out, boost->offset, boost->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < boost->entriesnum; i++) {
		fprintf(out, "	%i: pstate %x min %d MHz max %d MHz\n", i,
			boost->entries[i].pstate, boost->entries[i].min,
			boost->entries[i].max);
		envy_bios_dump_hex(bios, out, boost->entries[i].offset, boost->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");


		for (j = 0; j < boost->snr; j++) {
			struct envy_bios_power_boost_subentry *sub = &boost->entries[i].entries[j];
			fprintf(stdout, "		%i: domain %x percent %d min %d max %d\n",
				j, sub->domain, sub->percent, sub->min, sub->max);
			envy_bios_dump_hex(bios, out, sub->offset, boost->ssz, mask);
			if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
		}
	}

	fprintf(out, "\n");
}